

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O0

void __thiscall Ui_MainWindow::setupUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  QMainWindow *pQVar1;
  bool bVar2;
  QWidget *pQVar3;
  QGridLayout *pQVar4;
  QMarkdownTextEdit *pQVar5;
  QMenuBar *pQVar6;
  QToolBar *pQVar7;
  QStatusBar *pQVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView local_1a0;
  QString local_190;
  QByteArrayView local_178;
  QString local_168;
  QRect local_150;
  QByteArrayView local_140;
  QString local_130;
  QFlags<Qt::AlignmentFlag> local_114;
  QByteArrayView local_110;
  QString local_100;
  QByteArrayView local_e8;
  QString local_d8;
  QByteArrayView local_c0;
  QString local_b0;
  QFlags<Qt::WindowType> local_94;
  QByteArrayView local_90;
  QString local_80;
  QByteArrayView local_68;
  QString local_58;
  QString local_30;
  QMainWindow *local_18;
  QMainWindow *MainWindow_local;
  Ui_MainWindow *this_local;
  
  local_18 = MainWindow;
  MainWindow_local = (QMainWindow *)this;
  QObject::objectName();
  bVar2 = QString::isEmpty(&local_30);
  QString::~QString(&local_30);
  pQVar1 = local_18;
  if (bVar2) {
    QByteArrayView::QByteArrayView<11ul>(&local_68,(char (*) [11])"MainWindow");
    QVar9.m_data = (storage_type *)local_68.m_size;
    QVar9.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar9);
    QObject::setObjectName((QString *)pQVar1);
    QString::~QString(&local_58);
  }
  QWidget::resize((QWidget *)local_18,0x42e,0x347);
  pQVar1 = local_18;
  QByteArrayView::QByteArrayView<18ul>(&local_90,(char (*) [18])"QMarkdownTextEdit");
  QVar10.m_data = (storage_type *)local_90.m_size;
  QVar10.m_size = (qsizetype)&local_80;
  QString::fromUtf8(QVar10);
  QWidget::setWindowTitle((QString *)pQVar1);
  QString::~QString(&local_80);
  pQVar3 = (QWidget *)operator_new(0x28);
  pQVar1 = local_18;
  QFlags<Qt::WindowType>::QFlags(&local_94);
  QWidget::QWidget(pQVar3,(QWidget *)pQVar1,(QFlags_conflict1 *)(ulong)local_94.i);
  this->centralWidget = pQVar3;
  pQVar3 = this->centralWidget;
  QByteArrayView::QByteArrayView<14ul>(&local_c0,(char (*) [14])"centralWidget");
  QVar11.m_data = (storage_type *)local_c0.m_size;
  QVar11.m_size = (qsizetype)&local_b0;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar3);
  QString::~QString(&local_b0);
  pQVar4 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar4,this->centralWidget);
  this->gridLayout = pQVar4;
  (**(code **)(*(long *)this->gridLayout + 0x68))(this->gridLayout,6);
  QLayout::setContentsMargins((int)this->gridLayout,0xb,0xb,0xb);
  pQVar4 = this->gridLayout;
  QByteArrayView::QByteArrayView<11ul>(&local_e8,(char (*) [11])"gridLayout");
  QVar12.m_data = (storage_type *)local_e8.m_size;
  QVar12.m_size = (qsizetype)&local_d8;
  QString::fromUtf8(QVar12);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_d8);
  pQVar5 = (QMarkdownTextEdit *)operator_new(0x98);
  QMarkdownTextEdit::QMarkdownTextEdit(pQVar5,this->centralWidget,true);
  this->textEdit = pQVar5;
  pQVar5 = this->textEdit;
  QByteArrayView::QByteArrayView<9ul>(&local_110,(char (*) [9])"textEdit");
  QVar13.m_data = (storage_type *)local_110.m_size;
  QVar13.m_size = (qsizetype)&local_100;
  QString::fromUtf8(QVar13);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_100);
  pQVar3 = (QWidget *)this->gridLayout;
  pQVar5 = this->textEdit;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_114);
  QGridLayout::addWidget(pQVar3,(int)pQVar5,0,0,1,(QFlags_conflict1 *)0x1);
  QMainWindow::setCentralWidget((QWidget *)local_18);
  pQVar6 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(pQVar6,(QWidget *)local_18);
  this->menuBar = pQVar6;
  pQVar6 = this->menuBar;
  QByteArrayView::QByteArrayView<8ul>(&local_140,(char (*) [8])"menuBar");
  QVar14.m_data = (storage_type *)local_140.m_size;
  QVar14.m_size = (qsizetype)&local_130;
  QString::fromUtf8(QVar14);
  QObject::setObjectName((QString *)pQVar6);
  QString::~QString(&local_130);
  pQVar6 = this->menuBar;
  QRect::QRect(&local_150,0,0,0x42e,0x17);
  QWidget::setGeometry((QRect *)pQVar6);
  QMainWindow::setMenuBar((QMenuBar *)local_18);
  pQVar7 = (QToolBar *)operator_new(0x28);
  QToolBar::QToolBar(pQVar7,(QWidget *)local_18);
  this->mainToolBar = pQVar7;
  pQVar7 = this->mainToolBar;
  QByteArrayView::QByteArrayView<12ul>(&local_178,(char (*) [12])"mainToolBar");
  QVar15.m_data = (storage_type *)local_178.m_size;
  QVar15.m_size = (qsizetype)&local_168;
  QString::fromUtf8(QVar15);
  QObject::setObjectName((QString *)pQVar7);
  QString::~QString(&local_168);
  QMainWindow::addToolBar((ToolBarArea)local_18,(QToolBar *)0x4);
  pQVar8 = (QStatusBar *)operator_new(0x28);
  QStatusBar::QStatusBar(pQVar8,(QWidget *)local_18);
  this->statusBar = pQVar8;
  pQVar8 = this->statusBar;
  QByteArrayView::QByteArrayView<10ul>(&local_1a0,(char (*) [10])"statusBar");
  QVar16.m_data = (storage_type *)local_1a0.m_size;
  QVar16.m_size = (qsizetype)&local_190;
  QString::fromUtf8(QVar16);
  QObject::setObjectName((QString *)pQVar8);
  QString::~QString(&local_190);
  QMainWindow::setStatusBar((QStatusBar *)local_18);
  retranslateUi(this,local_18);
  QMetaObject::connectSlotsByName((QObject *)local_18);
  return;
}

Assistant:

void setupUi(QMainWindow *MainWindow)
    {
        if (MainWindow->objectName().isEmpty())
            MainWindow->setObjectName(QString::fromUtf8("MainWindow"));
        MainWindow->resize(1070, 839);
        MainWindow->setWindowTitle(QString::fromUtf8("QMarkdownTextEdit"));
        centralWidget = new QWidget(MainWindow);
        centralWidget->setObjectName(QString::fromUtf8("centralWidget"));
        gridLayout = new QGridLayout(centralWidget);
        gridLayout->setSpacing(6);
        gridLayout->setContentsMargins(11, 11, 11, 11);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        textEdit = new QMarkdownTextEdit(centralWidget);
        textEdit->setObjectName(QString::fromUtf8("textEdit"));

        gridLayout->addWidget(textEdit, 0, 0, 1, 1);

        MainWindow->setCentralWidget(centralWidget);
        menuBar = new QMenuBar(MainWindow);
        menuBar->setObjectName(QString::fromUtf8("menuBar"));
        menuBar->setGeometry(QRect(0, 0, 1070, 23));
        MainWindow->setMenuBar(menuBar);
        mainToolBar = new QToolBar(MainWindow);
        mainToolBar->setObjectName(QString::fromUtf8("mainToolBar"));
        MainWindow->addToolBar(Qt::TopToolBarArea, mainToolBar);
        statusBar = new QStatusBar(MainWindow);
        statusBar->setObjectName(QString::fromUtf8("statusBar"));
        MainWindow->setStatusBar(statusBar);

        retranslateUi(MainWindow);

        QMetaObject::connectSlotsByName(MainWindow);
    }